

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteEditionDefaults
          (CommandLineInterface *this,DescriptorPool *pool)

{
  Descriptor *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Status *this_01;
  basic_ostream<char,_std::char_traits<char>_> *this_02;
  char *pcVar4;
  int *piVar5;
  FeatureSetDefaults *this_03;
  string_view __str;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions_00;
  Edition in_stack_fffffffffffffdb8;
  undefined1 local_178 [8];
  CodedOutputStream coded_out;
  FileOutputStream out;
  int fd;
  Descriptor *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [8];
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  Edition local_70;
  Edition maximum;
  Edition minimum;
  undefined1 local_60 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  string_view local_38;
  Descriptor *local_28;
  Descriptor *feature_set;
  DescriptorPool *pool_local;
  CommandLineInterface *this_local;
  
  feature_set = (Descriptor *)pool;
  pool_local = (DescriptorPool *)this;
  if ((this->opensource_runtime_ & 1U) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &extensions.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"google.protobuf.FeatureSet");
    local_28 = DescriptorPool::FindMessageTypeByName(pool,stack0xffffffffffffffb8);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"google.protobuf.FeatureSet");
    local_28 = DescriptorPool::FindMessageTypeByName(pool,local_38);
  }
  if (local_28 == (Descriptor *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&this->edition_defaults_out_name_);
    poVar3 = std::operator<<(poVar3,
                             ": Could not find FeatureSet in descriptor pool.  Please make sure descriptor.proto is in your import path"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_60);
    DescriptorPool::FindAllExtensions
              ((DescriptorPool *)feature_set,local_28,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_60);
    local_70 = ProtocMinimumEdition();
    if (this->edition_defaults_minimum_ != EDITION_UNKNOWN) {
      local_70 = this->edition_defaults_minimum_;
    }
    defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1._52_4_ =
         ProtocMaximumEdition();
    this_00 = local_28;
    if (this->edition_defaults_maximum_ != EDITION_UNKNOWN) {
      defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1._52_4_ =
           this->edition_defaults_maximum_;
    }
    absl::lts_20250127::Span<google::protobuf::FieldDescriptor_const*const>::
    Span<std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,void,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>,int>
              ((Span<google::protobuf::FieldDescriptor_const*const> *)&local_c8,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_60);
    extensions_00.len_._0_4_ = local_70;
    extensions_00.ptr_ = (pointer)local_c0;
    extensions_00.len_._4_4_ = 0;
    FeatureResolver::CompileDefaults
              ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_b8,(FeatureResolver *)this_00
               ,local_c8,extensions_00,
               defaults.super_StatusOrData<google::protobuf::FeatureSetDefaults>.field_1._52_4_,
               in_stack_fffffffffffffdb8);
    bVar1 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::ok
                      ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_b8);
    if (bVar1) {
      do {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar2 = open(pcVar4,0x241,0x1b6);
        bVar1 = false;
        if (iVar2 < 0) {
          piVar5 = __errno_location();
          bVar1 = *piVar5 == 4;
        }
      } while (bVar1);
      if (iVar2 < 0) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        perror(pcVar4);
        this_local._7_1_ = 0;
      }
      else {
        protobuf::io::FileOutputStream::FileOutputStream
                  ((FileOutputStream *)&coded_out.start_count_,iVar2,-1);
        protobuf::io::CodedOutputStream::
        CodedOutputStream<google::protobuf::io::FileOutputStream,void>
                  ((CodedOutputStream *)local_178,(FileOutputStream *)&coded_out.start_count_);
        protobuf::io::CodedOutputStream::SetSerializationDeterministic
                  ((CodedOutputStream *)local_178,true);
        this_03 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::operator->
                            ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_b8);
        bVar1 = protobuf::MessageLite::SerializeToCodedStream
                          ((MessageLite *)this_03,(CodedOutputStream *)local_178);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&this->edition_defaults_out_name_
                                  );
          poVar3 = std::operator<<(poVar3,": ");
          iVar2 = protobuf::io::FileOutputStream::GetErrno
                            ((FileOutputStream *)&coded_out.start_count_);
          pcVar4 = strerror(iVar2);
          poVar3 = std::operator<<(poVar3,pcVar4);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          protobuf::io::FileOutputStream::Close((FileOutputStream *)&coded_out.start_count_);
          this_local._7_1_ = 0;
        }
        protobuf::io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_178);
        if (bVar1) {
          bVar1 = protobuf::io::FileOutputStream::Close((FileOutputStream *)&coded_out.start_count_)
          ;
          if (bVar1) {
            this_local._7_1_ = 1;
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cerr,
                                     (string *)&this->edition_defaults_out_name_);
            poVar3 = std::operator<<(poVar3,": ");
            iVar2 = protobuf::io::FileOutputStream::GetErrno
                              ((FileOutputStream *)&coded_out.start_count_);
            pcVar4 = strerror(iVar2);
            poVar3 = std::operator<<(poVar3,pcVar4);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = 0;
          }
        }
        protobuf::io::FileOutputStream::~FileOutputStream
                  ((FileOutputStream *)&coded_out.start_count_);
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&this->edition_defaults_out_name_);
      poVar3 = std::operator<<(poVar3,": ");
      this_01 = absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::status
                          ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_b8);
      __str = absl::lts_20250127::Status::message(this_01);
      this_02 = std::operator<<(poVar3,__str);
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::~StatusOr
              ((StatusOr<google::protobuf::FeatureSetDefaults> *)local_b8);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_60);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::WriteEditionDefaults(const DescriptorPool& pool) {
  const Descriptor* feature_set;
  if (opensource_runtime_) {
    feature_set = pool.FindMessageTypeByName("google.protobuf.FeatureSet");
  } else {
    feature_set = pool.FindMessageTypeByName("google.protobuf.FeatureSet");
  }
  if (feature_set == nullptr) {
    std::cerr << edition_defaults_out_name_
              << ": Could not find FeatureSet in descriptor pool.  Please make "
                 "sure descriptor.proto is in your import path"
              << std::endl;
    return false;
  }
  std::vector<const FieldDescriptor*> extensions;
  pool.FindAllExtensions(feature_set, &extensions);

  Edition minimum = ProtocMinimumEdition();
  if (edition_defaults_minimum_ != EDITION_UNKNOWN) {
    minimum = edition_defaults_minimum_;
  }
  Edition maximum = ProtocMaximumEdition();
  if (edition_defaults_maximum_ != EDITION_UNKNOWN) {
    maximum = edition_defaults_maximum_;
  }

  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(feature_set, extensions, minimum,
                                       maximum);
  if (!defaults.ok()) {
    std::cerr << edition_defaults_out_name_ << ": "
              << defaults.status().message() << std::endl;
    return false;
  }

  int fd;
  do {
    fd = open(edition_defaults_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(edition_defaults_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);

  {
    io::CodedOutputStream coded_out(&out);
    // Determinism is useful here because build outputs are sometimes checked
    // into version control.
    coded_out.SetSerializationDeterministic(true);
    if (!defaults->SerializeToCodedStream(&coded_out)) {
      std::cerr << edition_defaults_out_name_ << ": "
                << strerror(out.GetErrno()) << std::endl;
      out.Close();
      return false;
    }
  }

  if (!out.Close()) {
    std::cerr << edition_defaults_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}